

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

Solution * Utils::random_solution(void)

{
  Point *p;
  int iVar1;
  Solution *pSVar2;
  Vehicle *pVVar3;
  difference_type __d;
  Solution *pSVar4;
  ulong uVar5;
  int iVar6;
  int ec;
  Solution *local_68;
  Vehicle *v;
  int ec_1;
  iterator pit;
  list<Point_*,_std::allocator<Point_*>_> point_pool;
  
  pSVar2 = (Solution *)operator_new(0x20);
  (pSVar2->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)pSVar2;
  (pSVar2->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)pSVar2;
  (pSVar2->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node._M_size
       = 0;
  pVVar3 = (Vehicle *)operator_new(0x28);
  Vehicle::Vehicle(pVVar3,pSVar2);
  v = pVVar3;
  std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::push_back
            ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)pSVar2,&v);
  std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::list(&point_pool,&raw_rows_abi_cxx11_);
  std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::erase
            (&point_pool,
             (const_iterator)
             point_pool.super__List_base<Point_*,_std::allocator<Point_*>_>._M_impl._M_node.
             super__List_node_base._M_next);
  local_68 = pSVar2;
LAB_0010728c:
  do {
    pSVar2 = local_68;
    if (point_pool.super__List_base<Point_*,_std::allocator<Point_*>_>._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)&point_pool) {
      Solution::total_weight(local_68);
      std::__cxx11::_List_base<Point_*,_std::allocator<Point_*>_>::_M_clear
                (&point_pool.super__List_base<Point_*,_std::allocator<Point_*>_>);
      return pSVar2;
    }
    pit._M_node = point_pool.super__List_base<Point_*,_std::allocator<Point_*>_>._M_impl._M_node.
                  super__List_node_base._M_next;
    iVar1 = rand();
    iVar6 = 0;
    std::__advance<std::_List_iterator<Point*>,long>
              (&pit,(ulong)(long)iVar1 %
                    point_pool.super__List_base<Point_*,_std::allocator<Point_*>_>._M_impl._M_node.
                    _M_size);
    p = (Point *)pit._M_node[1]._M_next;
    std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::erase
              (&point_pool,(const_iterator)pit._M_node);
    ec = 0;
    pSVar4 = pSVar2;
    while (pSVar2 = (Solution *)
                    (pSVar2->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next, pSVar2 != pSVar4) {
      pVVar3 = (Vehicle *)
               (pSVar2->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
               _M_node._M_size;
      uVar5 = 0;
      while (pSVar4 = local_68,
            uVar5 <= (pVVar3->nodes).
                     super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
                     ._M_impl._M_node._M_size) {
        ec = 0;
        Vehicle::add_node(pVVar3,p,(int)uVar5,&ec);
        uVar5 = uVar5 + 1;
        iVar6 = ec;
        if (ec == 0) goto LAB_0010728c;
      }
    }
    if (iVar6 != 0) {
      pVVar3 = (Vehicle *)operator_new(0x28);
      pSVar2 = local_68;
      Vehicle::Vehicle(pVVar3,local_68);
      v = pVVar3;
      std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::push_back(&pSVar2->vehicles,&v);
      ec_1 = 0;
      Vehicle::add_node(v,p,0,&ec_1);
    }
  } while( true );
}

Assistant:

Solution *Utils::random_solution() {
    auto solution = new Solution;
    auto v = new Vehicle(solution);
    solution->vehicles.push_back(v);

    auto point_pool = Utils::raw_rows;
    point_pool.erase(point_pool.begin());
    while (!point_pool.empty()) {
        auto pit = point_pool.begin();
        std::advance(pit, rand() % point_pool.size());
        auto p = *pit;
        point_pool.erase(pit);
        auto ec = 0;
        for (auto vehicle: solution->vehicles) {
            for (auto i = 0; i <= vehicle->nodes.size(); ++i) {
                ec = 0;
                vehicle->add_node(p, i, ec);
                if (ec == 0)
                    goto leave;
            }
        }

        if (ec != 0) {
            v = new Vehicle(solution);
            solution->vehicles.push_back(v);
            auto ec = 0;
            v->add_node(p, 0, ec);
        }
        leave:;
    }
    solution->total_weight();
    return solution;
}